

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuApp.cpp
# Opt level: O0

void __thiscall
tcu::App::App(App *this,Platform *platform,Archive *archive,TestLog *log,CommandLine *cmdLine)

{
  bool bVar1;
  deUint32 dVar2;
  deBool dVar3;
  RunMode RVar4;
  char *pcVar5;
  qpWatchDog *pqVar6;
  qpCrashHandler *pqVar7;
  InternalError *pIVar8;
  TestContext *pTVar9;
  TestPackageRoot *this_00;
  TestPackageRegistry *packageRegistry;
  TestSessionExecutor *this_01;
  exception *e;
  RunMode runMode;
  CommandLine *cmdLine_local;
  TestLog *log_local;
  Archive *archive_local;
  Platform *platform_local;
  App *this_local;
  
  this->_vptr_App = (_func_int **)&PTR__App_00cc0308;
  this->m_platform = platform;
  this->m_watchDog = (qpWatchDog *)0x0;
  this->m_crashHandler = (qpCrashHandler *)0x0;
  de::Mutex::Mutex(&this->m_crashLock,0);
  this->m_crashed = false;
  this->m_testCtx = (TestContext *)0x0;
  this->m_testRoot = (TestPackageRoot *)0x0;
  this->m_testExecutor = (TestSessionExecutor *)0x0;
  pcVar5 = qpGetReleaseName();
  dVar2 = qpGetReleaseId();
  print("dEQP Core %s (0x%08x) starting..\n",pcVar5,(ulong)dVar2);
  pcVar5 = qpGetTargetName();
  print("  target implementation = \'%s\'\n",pcVar5);
  dVar3 = deSetRoundingMode(DE_ROUNDINGMODE_TO_NEAREST_EVEN);
  if (dVar3 == 0) {
    qpPrintf("WARNING: Failed to set floating-point rounding mode!\n");
  }
  RVar4 = CommandLine::getRunMode(cmdLine);
  bVar1 = CommandLine::isWatchDogEnabled(cmdLine);
  if (bVar1) {
    do {
      dVar3 = ::deGetFalse();
      if (dVar3 != 0) {
LAB_00a09712:
        pIVar8 = (InternalError *)__cxa_allocate_exception(0x38);
        InternalError::InternalError
                  (pIVar8,(char *)0x0,
                   "m_watchDog = qpWatchDog_create(onWatchdogTimeout, this, 300, 30)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuApp.cpp"
                   ,0x66);
        __cxa_throw(pIVar8,&InternalError::typeinfo,InternalError::~InternalError);
      }
      pqVar6 = qpWatchDog_create(onWatchdogTimeout,this,300,0x1e);
      this->m_watchDog = pqVar6;
      if (pqVar6 == (qpWatchDog *)0x0) goto LAB_00a09712;
      dVar3 = ::deGetFalse();
    } while (dVar3 != 0);
  }
  bVar1 = CommandLine::isCrashHandlingEnabled(cmdLine);
  if (bVar1) {
    do {
      dVar3 = ::deGetFalse();
      if (dVar3 != 0) {
LAB_00a0981d:
        pIVar8 = (InternalError *)__cxa_allocate_exception(0x38);
        InternalError::InternalError
                  (pIVar8,(char *)0x0,"m_crashHandler = qpCrashHandler_create(onCrash, this)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuApp.cpp"
                   ,0x6a);
        __cxa_throw(pIVar8,&InternalError::typeinfo,InternalError::~InternalError);
      }
      pqVar7 = qpCrashHandler_create(onCrash,this);
      this->m_crashHandler = pqVar7;
      if (pqVar7 == (qpCrashHandler *)0x0) goto LAB_00a0981d;
      dVar3 = ::deGetFalse();
    } while (dVar3 != 0);
  }
  pTVar9 = (TestContext *)operator_new(0x60);
  TestContext::TestContext(pTVar9,this->m_platform,archive,log,cmdLine,this->m_watchDog);
  this->m_testCtx = pTVar9;
  this_00 = (TestPackageRoot *)operator_new(0x70);
  pTVar9 = this->m_testCtx;
  packageRegistry = TestPackageRegistry::getSingleton();
  TestPackageRoot::TestPackageRoot(this_00,pTVar9,packageRegistry);
  this->m_testRoot = this_00;
  if (RVar4 == RUNMODE_EXECUTE) {
    this_01 = (TestSessionExecutor *)operator_new(0xa8);
    TestSessionExecutor::TestSessionExecutor(this_01,this->m_testRoot,this->m_testCtx);
    this->m_testExecutor = this_01;
  }
  else if (RVar4 == RUNMODE_DUMP_STDOUT_CASELIST) {
    writeCaselistsToStdout(this->m_testRoot,this->m_testCtx);
  }
  else if (RVar4 == RUNMODE_DUMP_XML_CASELIST) {
    writeXmlCaselistsToFiles(this->m_testRoot,this->m_testCtx,cmdLine);
  }
  else if (RVar4 == RUNMODE_DUMP_TEXT_CASELIST) {
    writeTxtCaselistsToFiles(this->m_testRoot,this->m_testCtx,cmdLine);
  }
  return;
}

Assistant:

App::App (Platform& platform, Archive& archive, TestLog& log, const CommandLine& cmdLine)
	: m_platform		(platform)
	, m_watchDog		(DE_NULL)
	, m_crashHandler	(DE_NULL)
	, m_crashed			(false)
	, m_testCtx			(DE_NULL)
	, m_testRoot		(DE_NULL)
	, m_testExecutor	(DE_NULL)
{
	print("dEQP Core %s (0x%08x) starting..\n", qpGetReleaseName(), qpGetReleaseId());
	print("  target implementation = '%s'\n", qpGetTargetName());

	if (!deSetRoundingMode(DE_ROUNDINGMODE_TO_NEAREST_EVEN))
		qpPrintf("WARNING: Failed to set floating-point rounding mode!\n");

	try
	{
		const RunMode	runMode	= cmdLine.getRunMode();

		// Initialize watchdog
		if (cmdLine.isWatchDogEnabled())
			TCU_CHECK_INTERNAL(m_watchDog = qpWatchDog_create(onWatchdogTimeout, this, 300, 30));

		// Initialize crash handler.
		if (cmdLine.isCrashHandlingEnabled())
			TCU_CHECK_INTERNAL(m_crashHandler = qpCrashHandler_create(onCrash, this));

		// Create test context
		m_testCtx = new TestContext(m_platform, archive, log, cmdLine, m_watchDog);

		// Create root from registry
		m_testRoot = new TestPackageRoot(*m_testCtx, TestPackageRegistry::getSingleton());

		// \note No executor is created if runmode is not EXECUTE
		if (runMode == RUNMODE_EXECUTE)
			m_testExecutor = new TestSessionExecutor(*m_testRoot, *m_testCtx);
		else if (runMode == RUNMODE_DUMP_STDOUT_CASELIST)
			writeCaselistsToStdout(*m_testRoot, *m_testCtx);
		else if (runMode == RUNMODE_DUMP_XML_CASELIST)
			writeXmlCaselistsToFiles(*m_testRoot, *m_testCtx, cmdLine);
		else if (runMode == RUNMODE_DUMP_TEXT_CASELIST)
			writeTxtCaselistsToFiles(*m_testRoot, *m_testCtx, cmdLine);
		else
			DE_ASSERT(false);
	}
	catch (const std::exception& e)
	{
		cleanup();
		die("Failed to initialize dEQP: %s", e.what());
	}
}